

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O2

bool google::protobuf::compiler::ruby::GenerateFile
               (FileDescriptor *file,Printer *printer,string *error)

{
  int iVar1;
  bool bVar2;
  FileDescriptor *import;
  int index;
  int i_2;
  long lVar3;
  int i;
  long lVar4;
  allocator<char> local_79;
  int local_78;
  int local_74;
  string local_70;
  string local_50;
  
  io::Printer::Print(printer,
                     "# Generated by the protocol buffer compiler.  DO NOT EDIT!\n# source: $filename$\n\n"
                     ,"filename",*(string **)file);
  io::Printer::Print(printer,"require \'google/protobuf\'\n\n");
  iVar1 = 0;
  while (index = iVar1, local_74 = *(int *)(file + 0x18), index < local_74) {
    import = FileDescriptor::dependency(file,index);
    bVar2 = MaybeEmitDependency(import,file,printer,error);
    iVar1 = index + 1;
    if (!bVar2) goto LAB_00271422;
  }
  io::Printer::Print(printer,"Google::Protobuf::DescriptorPool.generated_pool.build do\n");
  io::Printer::Indent(printer);
  lVar3 = 0;
  for (lVar4 = 0; lVar4 < *(int *)(file + 0x58); lVar4 = lVar4 + 1) {
    GenerateMessage((Descriptor *)(*(long *)(file + 0x60) + lVar3),printer);
    lVar3 = lVar3 + 0xa8;
  }
  lVar3 = 0;
  for (lVar4 = 0; lVar4 < *(int *)(file + 0x68); lVar4 = lVar4 + 1) {
    GenerateEnum((EnumDescriptor *)(*(long *)(file + 0x70) + lVar3),printer);
    lVar3 = lVar3 + 0x38;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"end\n\n");
  std::__cxx11::string::string((string *)&local_50,*(string **)(file + 8));
  local_78 = GeneratePackageModules(&local_50,printer);
  std::__cxx11::string::~string((string *)&local_50);
  lVar4 = 0;
  for (lVar3 = 0; lVar3 < *(int *)(file + 0x58); lVar3 = lVar3 + 1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_79);
    GenerateMessageAssignment(&local_70,(Descriptor *)(*(long *)(file + 0x60) + lVar4),printer);
    std::__cxx11::string::~string((string *)&local_70);
    lVar4 = lVar4 + 0xa8;
  }
  lVar4 = 0;
  for (lVar3 = 0; lVar3 < *(int *)(file + 0x68); lVar3 = lVar3 + 1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_79);
    GenerateEnumAssignment(&local_70,(EnumDescriptor *)(*(long *)(file + 0x70) + lVar4),printer);
    std::__cxx11::string::~string((string *)&local_70);
    lVar4 = lVar4 + 0x38;
  }
  EndPackageModules(local_78,printer);
LAB_00271422:
  return local_74 <= index;
}

Assistant:

bool GenerateFile(const FileDescriptor* file, io::Printer* printer,
                  string* error) {
  printer->Print(
    "# Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
    "# source: $filename$\n"
    "\n",
    "filename", file->name());

  printer->Print(
    "require 'google/protobuf'\n\n");

  for (int i = 0; i < file->dependency_count(); i++) {
    if (!MaybeEmitDependency(file->dependency(i), file, printer, error)) {
      return false;
    }
  }

  printer->Print(
    "Google::Protobuf::DescriptorPool.generated_pool.build do\n");
  printer->Indent();
  for (int i = 0; i < file->message_type_count(); i++) {
    GenerateMessage(file->message_type(i), printer);
  }
  for (int i = 0; i < file->enum_type_count(); i++) {
    GenerateEnum(file->enum_type(i), printer);
  }
  printer->Outdent();
  printer->Print(
    "end\n\n");

  int levels = GeneratePackageModules(file->package(), printer);
  for (int i = 0; i < file->message_type_count(); i++) {
    GenerateMessageAssignment("", file->message_type(i), printer);
  }
  for (int i = 0; i < file->enum_type_count(); i++) {
    GenerateEnumAssignment("", file->enum_type(i), printer);
  }
  EndPackageModules(levels, printer);
  return true;
}